

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

ON_Interval
ON_BsplineControlPointSupport
          (int order,int control_point_count,double *knots,int control_point_index)

{
  ON_2dex OVar1;
  ON_Interval OVar2;
  ON_Interval local_28;
  
  if (knots != (double *)0x0) {
    OVar1 = ON_BsplineControlPointSpans(order,control_point_count,control_point_index);
    if (OVar1.i < OVar1.j) {
      ON_Interval::ON_Interval
                (&local_28,knots[(long)(OVar1.i + order) + -2],knots[(long)(OVar1.j + order) + -2]);
      goto LAB_004bb4d6;
    }
  }
  local_28.m_t[0] = ON_Interval::Nan.m_t[0];
  local_28.m_t[1] = ON_Interval::Nan.m_t[1];
LAB_004bb4d6:
  OVar2.m_t[0] = local_28.m_t[0];
  OVar2.m_t[1] = local_28.m_t[1];
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_DECL const ON_Interval ON_BsplineControlPointSupport(int order, int control_point_count, const double* knots, int control_point_index)
{
  for (;;)
  {
    if (nullptr == knots)
      break;
    const ON_2dex active_spans = ON_BsplineControlPointSpans(order, control_point_count, control_point_index);
    if (active_spans.i <  active_spans.j)
      return ON_Interval(knots[active_spans.i + order - 2], knots[active_spans.j + order - 2]);
    break;
  }  
  return ON_Interval::Nan;
}